

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O1

int WebRtcVad_CalcVad16khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  int iVar1;
  int16_t speechNB [240];
  int16_t aiStack_1f8 [240];
  
  WebRtcVad_Downsampling(speech_frame,aiStack_1f8,inst->downsampling_filter_states,frame_length);
  iVar1 = WebRtcVad_CalcVad8khz(inst,aiStack_1f8,frame_length >> 1);
  return iVar1;
}

Assistant:

int WebRtcVad_CalcVad16khz(VadInstT* inst, const int16_t* speech_frame,
                           size_t frame_length)
{
    size_t len;
    int vad;
    int16_t speechNB[240]; // Downsampled speech frame: 480 samples (30ms in WB)

    // Wideband: Downsample signal before doing VAD
    WebRtcVad_Downsampling(speech_frame, speechNB, inst->downsampling_filter_states,
                           frame_length);

    len = frame_length / 2;
    vad = WebRtcVad_CalcVad8khz(inst, speechNB, len);

    return vad;
}